

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O1

void __thiscall
Employee::Employee(Employee *this,string *name,string *id,Address *address,int hourWork,
                  int salaryPerHour,int workToDo,int workDone)

{
  Person::Person(&this->super_Person,name,id,address);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_00108d48;
  this->hourWork = hourWork;
  this->salaryPerHour = salaryPerHour;
  this->workToDo = workToDo;
  this->workDone = workDone;
  validate(this);
  return;
}

Assistant:

Employee::Employee(const string &name, const string &id, const Address &address, int hourWork, int salaryPerHour,
                   int workToDo, int workDone) : Person(name, id, address), hourWork(hourWork),
                                                 salaryPerHour(salaryPerHour), workToDo(workToDo),
                                                 workDone(workDone) { validate(); }